

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O0

shared_ptr<hittable_list> box(point3 *a,point3 *b,shared_ptr<material> *mat)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  shared_ptr<hittable_list> sVar12;
  vec3 local_250;
  undefined1 local_238 [32];
  vec3 local_218;
  vec3 local_200;
  undefined1 local_1e8 [32];
  vec3 local_1c8;
  undefined1 local_1b0 [32];
  vec3 local_190;
  vec3 local_178;
  undefined1 local_160 [32];
  vec3 local_140;
  vec3 local_128;
  undefined1 local_110 [32];
  vec3 local_f0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [8];
  vec3 dz;
  vec3 dy;
  vec3 dx;
  point3 max;
  undefined1 local_48 [8];
  point3 min;
  shared_ptr<material> *mat_local;
  point3 *b_local;
  point3 *a_local;
  shared_ptr<hittable_list> *sides;
  
  min.e[2]._7_1_ = 0;
  std::make_shared<hittable_list>();
  dVar2 = vec3::x(b);
  dVar3 = vec3::x((vec3 *)mat);
  dVar8 = dVar3;
  if (dVar2 <= dVar3) {
    dVar8 = dVar2;
  }
  dVar4 = vec3::y(b);
  dVar5 = vec3::y((vec3 *)mat);
  dVar9 = dVar5;
  if (dVar4 <= dVar5) {
    dVar9 = dVar4;
  }
  dVar6 = vec3::z(b);
  dVar7 = vec3::z((vec3 *)mat);
  uVar10 = SUB84(dVar7,0);
  uVar11 = (int)((ulong)dVar7 >> 0x20);
  if (dVar6 <= dVar7) {
    uVar10 = SUB84(dVar6,0);
    uVar11 = (int)((ulong)dVar6 >> 0x20);
  }
  vec3::vec3((vec3 *)local_48,
             (double)(~-(ulong)NAN(dVar2) & (ulong)dVar8 | -(ulong)NAN(dVar2) & (ulong)dVar3),
             (double)(~-(ulong)NAN(dVar4) & (ulong)dVar9 | -(ulong)NAN(dVar4) & (ulong)dVar5),
             (double)(~-(ulong)NAN(dVar6) & CONCAT44(uVar11,uVar10) |
                     -(ulong)NAN(dVar6) & (ulong)dVar7));
  dVar2 = vec3::x(b);
  dVar3 = vec3::x((vec3 *)mat);
  dVar8 = dVar3;
  if (dVar3 <= dVar2) {
    dVar8 = dVar2;
  }
  dVar4 = vec3::y(b);
  dVar5 = vec3::y((vec3 *)mat);
  dVar9 = dVar5;
  if (dVar5 <= dVar4) {
    dVar9 = dVar4;
  }
  dVar6 = vec3::z(b);
  dVar7 = vec3::z((vec3 *)mat);
  uVar10 = SUB84(dVar7,0);
  uVar11 = (int)((ulong)dVar7 >> 0x20);
  if (dVar7 <= dVar6) {
    uVar10 = SUB84(dVar6,0);
    uVar11 = (int)((ulong)dVar6 >> 0x20);
  }
  vec3::vec3((vec3 *)(dx.e + 2),
             (double)(~-(ulong)NAN(dVar2) & (ulong)dVar8 | -(ulong)NAN(dVar2) & (ulong)dVar3),
             (double)(~-(ulong)NAN(dVar4) & (ulong)dVar9 | -(ulong)NAN(dVar4) & (ulong)dVar5),
             (double)(~-(ulong)NAN(dVar6) & CONCAT44(uVar11,uVar10) |
                     -(ulong)NAN(dVar6) & (ulong)dVar7));
  dVar8 = vec3::x((vec3 *)(dx.e + 2));
  dVar2 = vec3::x((vec3 *)local_48);
  vec3::vec3((vec3 *)(dy.e + 2),dVar8 - dVar2,0.0,0.0);
  dVar8 = vec3::y((vec3 *)(dx.e + 2));
  dVar2 = vec3::y((vec3 *)local_48);
  vec3::vec3((vec3 *)(dz.e + 2),0.0,dVar8 - dVar2,0.0);
  dVar8 = vec3::z((vec3 *)(dx.e + 2));
  dVar2 = vec3::z((vec3 *)local_48);
  vec3::vec3((vec3 *)local_b8,0.0,0.0,dVar8 - dVar2);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)local_48);
  dVar2 = vec3::y((vec3 *)local_48);
  dVar3 = vec3::z((vec3 *)(dx.e + 2));
  vec3::vec3(&local_f0,dVar8,dVar2,dVar3);
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((vec3 *)local_d8,&local_f0,(vec3 *)(dy.e + 2),(shared_ptr<material> *)(dz.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_d8 + 0x10),(shared_ptr<quad> *)local_d8);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_d8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_d8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_d8);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)(dx.e + 2));
  dVar2 = vec3::y((vec3 *)local_48);
  dVar3 = vec3::z((vec3 *)(dx.e + 2));
  vec3::vec3(&local_128,dVar8,dVar2,dVar3);
  vec3::operator-(&local_140,(vec3 *)local_b8);
  std::make_shared<quad,vec3,vec3,vec3&,std::shared_ptr<material>&>
            ((vec3 *)local_110,&local_128,&local_140,(shared_ptr<material> *)(dz.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_110 + 0x10),(shared_ptr<quad> *)local_110);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_110 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_110 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_110);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)(dx.e + 2));
  dVar2 = vec3::y((vec3 *)local_48);
  dVar3 = vec3::z((vec3 *)local_48);
  vec3::vec3(&local_178,dVar8,dVar2,dVar3);
  vec3::operator-(&local_190,(vec3 *)(dy.e + 2));
  std::make_shared<quad,vec3,vec3,vec3&,std::shared_ptr<material>&>
            ((vec3 *)local_160,&local_178,&local_190,(shared_ptr<material> *)(dz.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_160 + 0x10),(shared_ptr<quad> *)local_160);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_160 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_160 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_160);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)local_48);
  dVar2 = vec3::y((vec3 *)local_48);
  dVar3 = vec3::z((vec3 *)local_48);
  vec3::vec3(&local_1c8,dVar8,dVar2,dVar3);
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((vec3 *)local_1b0,&local_1c8,(vec3 *)local_b8,(shared_ptr<material> *)(dz.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_1b0 + 0x10),(shared_ptr<quad> *)local_1b0);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_1b0 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_1b0 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_1b0);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)local_48);
  dVar2 = vec3::y((vec3 *)(dx.e + 2));
  dVar3 = vec3::z((vec3 *)(dx.e + 2));
  vec3::vec3(&local_200,dVar8,dVar2,dVar3);
  vec3::operator-(&local_218,(vec3 *)local_b8);
  std::make_shared<quad,vec3,vec3&,vec3,std::shared_ptr<material>&>
            ((vec3 *)local_1e8,&local_200,(vec3 *)(dy.e + 2),(shared_ptr<material> *)&local_218);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_1e8 + 0x10),(shared_ptr<quad> *)local_1e8);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_1e8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_1e8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_1e8);
  peVar1 = std::__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hittable_list,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)a);
  dVar8 = vec3::x((vec3 *)local_48);
  dVar2 = vec3::y((vec3 *)local_48);
  dVar3 = vec3::z((vec3 *)local_48);
  vec3::vec3(&local_250,dVar8,dVar2,dVar3);
  std::make_shared<quad,vec3,vec3&,vec3&,std::shared_ptr<material>&>
            ((vec3 *)local_238,&local_250,(vec3 *)(dy.e + 2),(shared_ptr<material> *)local_b8);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_238 + 0x10),(shared_ptr<quad> *)local_238);
  hittable_list::add(peVar1,(shared_ptr<hittable> *)(local_238 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_238 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_238);
  sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)a;
  return (shared_ptr<hittable_list>)
         sVar12.super___shared_ptr<hittable_list,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline shared_ptr<hittable_list> box(const point3& a, const point3& b, shared_ptr<material> mat)
{
    // Returns the 3D box (six sides) that contains the two opposite vertices a & b.

    auto sides = make_shared<hittable_list>();

    // Construct the two opposite vertices with the minimum and maximum coordinates.
    auto min = point3(std::fmin(a.x(),b.x()), std::fmin(a.y(),b.y()), std::fmin(a.z(),b.z()));
    auto max = point3(std::fmax(a.x(),b.x()), std::fmax(a.y(),b.y()), std::fmax(a.z(),b.z()));

    auto dx = vec3(max.x() - min.x(), 0, 0);
    auto dy = vec3(0, max.y() - min.y(), 0);
    auto dz = vec3(0, 0, max.z() - min.z());

    sides->add(make_shared<quad>(point3(min.x(), min.y(), max.z()),  dx,  dy, mat)); // front
    sides->add(make_shared<quad>(point3(max.x(), min.y(), max.z()), -dz,  dy, mat)); // right
    sides->add(make_shared<quad>(point3(max.x(), min.y(), min.z()), -dx,  dy, mat)); // back
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dz,  dy, mat)); // left
    sides->add(make_shared<quad>(point3(min.x(), max.y(), max.z()),  dx, -dz, mat)); // top
    sides->add(make_shared<quad>(point3(min.x(), min.y(), min.z()),  dx,  dz, mat)); // bottom

    return sides;
}